

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall kj::Vector<char>::setCapacity(Vector<char> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<char> *pAVar2;
  __off_t __length;
  undefined1 local_38 [8];
  ArrayBuilder<char> newBuilder;
  size_t newSize_local;
  Vector<char> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)ArrayBuilder<char>::size(&this->builder);
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<char>::truncate(&this->builder,(char *)newBuilder.disposer,__length);
  }
  heapArrayBuilder<char>((ArrayBuilder<char> *)local_38,(size_t)newBuilder.disposer);
  pAVar2 = mv<kj::ArrayBuilder<char>>(&this->builder);
  ArrayBuilder<char>::addAll<kj::ArrayBuilder<char>>((ArrayBuilder<char> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<char>>((ArrayBuilder<char> *)local_38);
  ArrayBuilder<char>::operator=(&this->builder,pAVar2);
  ArrayBuilder<char>::~ArrayBuilder((ArrayBuilder<char> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }